

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderMD.cpp
# Opt level: O1

BYTE __thiscall EncoderMD::EmitModRM(EncoderMD *this,Instr *instr,Opnd *opnd,BYTE reg1)

{
  char cVar1;
  Opnd *opnd_00;
  byte *pbVar2;
  BYTE *pBVar3;
  _func_int **pp_Var4;
  code *pcVar5;
  int opSize;
  bool bVar6;
  OpndKind OVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  BYTE BVar11;
  undefined4 *puVar12;
  char *pcVar13;
  char *error;
  Opnd *opnd_01;
  uint lineNumber;
  EncoderMD *this_00;
  byte bVar14;
  RegNum local_35;
  int local_34;
  RegNum rmReg;
  int dispSize;
  
  local_34 = -1;
  if (7 < reg1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                       ,0x13c,"((reg1 & 7) == reg1)","Invalid reg1");
    if (!bVar6) goto LAB_00643784;
    *puVar12 = 0;
  }
  OVar7 = IR::Opnd::GetKind(opnd);
  if (OVar7 - 7 < 6) {
    bVar14 = reg1 << 3 & 0x38;
    switch((uint)OVar7) {
    case 7:
      OVar7 = IR::Opnd::GetKind(opnd);
      if (OVar7 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar6) goto LAB_00643784;
        *puVar12 = 0;
      }
      if (*(char *)((long)opnd[1]._vptr_Opnd + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                           ,0x154,"(opnd->AsSymOpnd()->m_sym->IsStackSym())",
                           "Should only see stackSym syms in encoder.");
        if (!bVar6) goto LAB_00643784;
        *puVar12 = 0;
      }
      OVar7 = IR::Opnd::GetKind(opnd);
      if (OVar7 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar6) goto LAB_00643784;
        *puVar12 = 0;
      }
      this_00 = this;
      bVar8 = GetMod(this,(SymOpnd *)opnd,&local_34,&local_35);
      bVar9 = GetRegEncode(this_00,local_35);
      pbVar2 = this->m_pc;
      this->m_pc = pbVar2 + 1;
      *pbVar2 = bVar8 | bVar14 | bVar9;
      if (local_35 == RegRSP) {
        pBVar3 = this->m_pc;
        this->m_pc = pBVar3 + 1;
        *pBVar3 = (bVar9 & 7) * '\t';
        goto LAB_0064350d;
      }
      OVar7 = IR::Opnd::GetKind(opnd);
      if (OVar7 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar6) goto LAB_00643784;
        *puVar12 = 0;
      }
      pp_Var4 = opnd[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var4 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar6) goto LAB_00643784;
        *puVar12 = 0;
      }
      if (*(int *)(pp_Var4 + 4) != 0) goto LAB_0064350d;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      error = "(opnd->AsSymOpnd()->m_sym->AsStackSym()->m_offset)";
      pcVar13 = "Expected stackSym offset to be set.";
      lineNumber = 0x164;
      goto LAB_00643426;
    case 8:
      pcVar13 = (char *)opnd;
      OVar7 = IR::Opnd::GetKind(opnd);
      if (OVar7 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        pcVar13 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
        ;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar6) goto LAB_00643784;
        *puVar12 = 0;
      }
      if (*(byte *)((long)&opnd[1].m_valueType.field_0.bits + 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        pcVar13 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
        ;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                           ,0x145,"(regOpnd->GetReg() != RegNOREG)",
                           "All regOpnd should have a valid reg set during encoder");
        if (!bVar6) goto LAB_00643784;
        *puVar12 = 0;
      }
      bVar14 = GetRegEncode((EncoderMD *)pcVar13,
                            *(RegNum *)((long)&opnd[1].m_valueType.field_0.bits + 1));
      *this->m_pc = reg1 << 3 | bVar14 | 0xc0;
      this->m_pc = this->m_pc + 1;
      bVar14 = *(byte *)((long)&opnd[1].m_valueType.field_0.bits + 1);
      return (byte)(((byte)(bVar14 - 0x11) < 0x10) << 4 | 8U) < bVar14;
    default:
      goto switchD_00642ee7_caseD_9;
    case 10:
      pcVar13 = (char *)opnd;
      OVar7 = IR::Opnd::GetKind(opnd);
      if (OVar7 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        pcVar13 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
        ;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar6) goto LAB_00643784;
        *puVar12 = 0;
      }
      opnd_00 = (Opnd *)opnd[1]._vptr_Opnd;
      opnd_01 = *(Opnd **)&opnd[1].m_valueType;
      if ((opnd_01 != (Opnd *)0x0) &&
         (*(byte *)((long)&opnd_01[1].m_valueType.field_0.bits + 1) == 5)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        pcVar13 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
        ;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                           ,0x16f,"(!indexOpnd || indexOpnd->GetReg() != RegRSP)",
                           "ESP cannot be the index of an indir.");
        if (!bVar6) goto LAB_00643784;
        *puVar12 = 0;
      }
      if (opnd_00 == (Opnd *)0x0) {
        if (opnd_01 == (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          pcVar13 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
          ;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                             ,0x172,"(indexOpnd != nullptr)","indexOpnd != nullptr");
          if (!bVar6) goto LAB_00643784;
          *puVar12 = 0;
        }
        bVar8 = GetRegEncode((EncoderMD *)pcVar13,
                             *(RegNum *)((long)&opnd_01[1].m_valueType.field_0.bits + 1));
        local_34 = 4;
        pbVar2 = this->m_pc;
        this->m_pc = pbVar2 + 1;
        *pbVar2 = bVar14 | 4;
        cVar1 = *(char *)((long)&opnd[2]._vptr_Opnd + 4);
        pbVar2 = this->m_pc;
        this->m_pc = pbVar2 + 1;
        *pbVar2 = (bVar8 & 7) << 3 | cVar1 << 6 | 5;
        BVar11 = '\x02';
LAB_00643777:
        bVar14 = GetRexByte((EncoderMD *)pcVar13,BVar11,opnd_01);
      }
      else {
        bVar8 = GetRegEncode((EncoderMD *)pcVar13,
                             *(RegNum *)((long)&opnd_00[1].m_valueType.field_0.bits + 1));
        if (opnd_01 == (Opnd *)0x0) {
          if ((*(byte *)((long)&opnd_00[1].m_valueType.field_0.bits + 1) | 8) == 0xd) {
            bVar9 = GetMod((EncoderMD *)pcVar13,(long)*(int *)&opnd[2]._vptr_Opnd,
                           (*(byte *)((long)opnd[1]._vptr_Opnd + 0x19) & 0xf7) == 6,&local_34);
            pbVar2 = this->m_pc;
            this->m_pc = pbVar2 + 1;
            *pbVar2 = bVar14 | bVar8 | bVar9;
            pBVar3 = this->m_pc;
            this->m_pc = pBVar3 + 1;
            *pBVar3 = (bVar8 & 7) * '\t';
          }
          else {
            bVar9 = GetMod((EncoderMD *)pcVar13,(long)*(int *)&opnd[2]._vptr_Opnd,
                           (*(byte *)((long)opnd[1]._vptr_Opnd + 0x19) & 0xf7) == 6,&local_34);
            pbVar2 = this->m_pc;
            this->m_pc = pbVar2 + 1;
            *pbVar2 = bVar14 | bVar8 | bVar9;
          }
          BVar11 = '\x01';
          opnd_01 = opnd_00;
          goto LAB_00643777;
        }
        bVar9 = GetRegEncode((EncoderMD *)pcVar13,
                             *(RegNum *)((long)&opnd_01[1].m_valueType.field_0.bits + 1));
        bVar10 = GetMod((EncoderMD *)pcVar13,(long)*(int *)&opnd[2]._vptr_Opnd,
                        (*(byte *)((long)opnd[1]._vptr_Opnd + 0x19) & 0xf7) == 6,&local_34);
        pbVar2 = this->m_pc;
        this->m_pc = pbVar2 + 1;
        *pbVar2 = bVar14 | bVar10 | 4;
        cVar1 = *(char *)((long)&opnd[2]._vptr_Opnd + 4);
        pbVar2 = this->m_pc;
        this->m_pc = pbVar2 + 1;
        *pbVar2 = bVar8 & 7 | (bVar9 & 7) << 3 | cVar1 << 6;
        bVar8 = GetRexByte((EncoderMD *)pcVar13,'\x02',opnd_01);
        bVar14 = GetRexByte((EncoderMD *)pcVar13,'\x01',opnd_00);
        bVar14 = bVar14 | bVar8;
      }
      break;
    case 0xc:
      pbVar2 = this->m_pc;
      this->m_pc = pbVar2 + 1;
      *pbVar2 = bVar14 | 4;
      pBVar3 = this->m_pc;
      this->m_pc = pBVar3 + 1;
      *pBVar3 = '%';
      OVar7 = IR::Opnd::GetKind(opnd);
      if (OVar7 != OpndKindMemRef) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1ec,"(this->IsMemRefOpnd())","Bad call to AsMemRefOpnd()");
        if (!bVar6) goto LAB_00643784;
        *puVar12 = 0;
      }
      if ((_func_int **)(long)(int)opnd[1]._vptr_Opnd != opnd[1]._vptr_Opnd) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                           ,0x19c,"(Math::FitsInDWord((size_t)opnd->AsMemRefOpnd()->GetMemLoc()))",
                           "Size overflow");
        if (!bVar6) goto LAB_00643784;
        *puVar12 = 0;
      }
      local_34 = 4;
      goto LAB_0064350d;
    }
  }
  else {
switchD_00642ee7_caseD_9:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    error = "((0))";
    pcVar13 = "Unexpected operand kind";
    lineNumber = 0x1a1;
LAB_00643426:
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                       ,lineNumber,error,pcVar13);
    if (!bVar6) goto LAB_00643784;
    *puVar12 = 0;
LAB_0064350d:
    bVar14 = 0;
  }
  opSize = local_34;
  if (local_34 == -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                       ,0x1a5,"(dispSize != -1)","Uninitialized dispSize");
    if (!bVar6) goto LAB_00643784;
    *puVar12 = 0;
  }
  BVar11 = EmitImmed(this,opnd,opSize,0,false);
  if (BVar11 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                       ,0x1a9,"(retval == 0)","Not possible.");
    if (!bVar6) {
LAB_00643784:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar12 = 0;
  }
  return bVar14;
}

Assistant:

BYTE
EncoderMD::EmitModRM(IR::Instr * instr, IR::Opnd *opnd, BYTE reg1)
{
    int dispSize = -1; // Initialize to suppress C4701 false positive
    IR::IndirOpnd *indirOpnd;
    IR::RegOpnd *regOpnd;
    IR::RegOpnd *baseOpnd;
    IR::RegOpnd *indexOpnd;
    BYTE reg;
    BYTE regBase;
    BYTE regIndex;
    BYTE baseRegEncode;
    BYTE rexEncoding = 0;

    AssertMsg( (reg1 & 7) == reg1, "Invalid reg1");

    reg1 = (reg1 & 7) << 3;       // mask and put in reg field

    switch (opnd->GetKind())
    {
    case IR::OpndKindReg:
        regOpnd = opnd->AsRegOpnd();

        AssertMsg(regOpnd->GetReg() != RegNOREG, "All regOpnd should have a valid reg set during encoder");

        reg = this->GetRegEncode(regOpnd);
        this->EmitConst((Mod11 | reg1 | reg), 1);

        if (this->IsExtendedRegister(regOpnd->GetReg()))
        {
            return REXB;
        }
        else
        {
            return 0;
        }

    case IR::OpndKindSym:
        AssertMsg(opnd->AsSymOpnd()->m_sym->IsStackSym(), "Should only see stackSym syms in encoder.");

        BYTE byte;
        RegNum rmReg;
        BYTE mod;
        mod = this->GetMod(opnd->AsSymOpnd(), &dispSize, rmReg);
        baseRegEncode = this->GetRegEncode(rmReg);
        byte = (BYTE)(mod | reg1 | baseRegEncode);
        *(m_pc++) = byte;
        if (rmReg == RegRSP)
        {
            byte = (BYTE)(((baseRegEncode & 7) << 3) | (baseRegEncode & 7));
            *(m_pc++) = byte;
        }
        else
        {
            AssertMsg(opnd->AsSymOpnd()->m_sym->AsStackSym()->m_offset, "Expected stackSym offset to be set.");
        }
        break;

    case IR::OpndKindIndir:

        indirOpnd = opnd->AsIndirOpnd();

        baseOpnd = indirOpnd->GetBaseOpnd();
        indexOpnd = indirOpnd->GetIndexOpnd();

        AssertMsg(!indexOpnd || indexOpnd->GetReg() != RegRSP, "ESP cannot be the index of an indir.");
        if (baseOpnd == nullptr)
        {
            Assert(indexOpnd != nullptr);
            regIndex = this->GetRegEncode(indexOpnd);
            dispSize = 4;
            *(m_pc++) = ( Mod00 | reg1 | 0x4);
            *(m_pc++) = (((indirOpnd->GetScale() & 3) << 6) | ((regIndex & 7) << 3) | 0x5);

            rexEncoding |= this->GetRexByte(this->REXX, indexOpnd);
        }
        else
        {
            regBase = this->GetRegEncode(baseOpnd);

            if (indexOpnd != nullptr)
            {
                regIndex = this->GetRegEncode(indexOpnd);
                *(m_pc++) = (this->GetMod(indirOpnd, &dispSize) | reg1 | 0x4);
                *(m_pc++) = (((indirOpnd->GetScale() & 3) << 6) | ((regIndex & 7) << 3) | (regBase & 7));

                rexEncoding |= this->GetRexByte(this->REXX, indexOpnd);
                rexEncoding |= this->GetRexByte(this->REXB, baseOpnd);
            }
            else if (baseOpnd->GetReg() == RegR12 || baseOpnd->GetReg() == RegRSP)
            {
                //
                // Using RSP/R12 as base requires the SIB byte even where there is no index.
                //
                *(m_pc++) = (this->GetMod(indirOpnd, &dispSize) | reg1 | regBase);
                *(m_pc++) = (BYTE)(((regBase & 7) << 3) | (regBase & 7));

                rexEncoding |= this->GetRexByte(this->REXB, baseOpnd);
            }
            else
            {
                *(m_pc++) = (this->GetMod(indirOpnd, &dispSize) | reg1 | regBase);
                rexEncoding |= this->GetRexByte(this->REXB, baseOpnd);
            }
        }
        break;

    case IR::OpndKindMemRef:
        *(m_pc++)   = (char)(reg1 | 0x4);
        *(m_pc++)   = 0x25;       // SIB displacement
        AssertMsg(Math::FitsInDWord((size_t)opnd->AsMemRefOpnd()->GetMemLoc()), "Size overflow");
        dispSize    = 4;
        break;

    default:
        AssertMsg(UNREACHED, "Unexpected operand kind");
        break;
    }

    AssertMsg(dispSize != -1, "Uninitialized dispSize");

    BYTE retval = this->EmitImmed(opnd, dispSize, 0);

    AssertMsg(retval == 0, "Not possible.");
    return rexEncoding;
}